

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

jx9_hashmap *
jx9NewHashmap(jx9_vm *pVm,_func_sxu32_sxi64 *xIntHash,_func_sxu32_void_ptr_sxu32 *xBlobHash)

{
  jx9_hashmap *pjVar1;
  ulong uVar2;
  
  pjVar1 = (jx9_hashmap *)SyMemBackendPoolAlloc(&pVm->sAllocator,0x58);
  if (pjVar1 == (jx9_hashmap *)0x0) {
    pjVar1 = (jx9_hashmap *)0x0;
  }
  else {
    uVar2 = 0xfffffffffffffffc;
    do {
      *(undefined4 *)((long)&pjVar1->pVm + uVar2 + 4) = 0;
      uVar2 = uVar2 + 4;
    } while (uVar2 < 0x54);
    pjVar1->pVm = pVm;
    pjVar1->iRef = 1;
    pjVar1->xIntHash = IntHash;
    pjVar1->xBlobHash = BinHash;
  }
  return pjVar1;
}

Assistant:

JX9_PRIVATE jx9_hashmap * jx9NewHashmap(
	jx9_vm *pVm,              /* VM that trigger the hashmap creation */
	sxu32 (*xIntHash)(sxi64), /* Hash function for int keys.NULL otherwise*/
	sxu32 (*xBlobHash)(const void *, sxu32) /* Hash function for BLOB keys.NULL otherwise */
	)
{
	jx9_hashmap *pMap;
	/* Allocate a new instance */
	pMap = (jx9_hashmap *)SyMemBackendPoolAlloc(&pVm->sAllocator, sizeof(jx9_hashmap));
	if( pMap == 0 ){
		return 0;
	}
	/* Zero the structure */
	SyZero(pMap, sizeof(jx9_hashmap));
	/* Fill in the structure */
	pMap->pVm = &(*pVm);
	pMap->iRef = 1;
	/* pMap->iFlags = 0; */
	/* Default hash functions */
	pMap->xIntHash  = xIntHash ? xIntHash : IntHash;
	pMap->xBlobHash = xBlobHash ? xBlobHash : BinHash;
	return pMap;
}